

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

double entropy<unsigned_long>
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *freqs,size_t freqs_sum)

{
  bool bVar1;
  reference puVar2;
  undefined8 in_RSI;
  undefined1 auVar3 [64];
  undefined1 extraout_var [56];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double p;
  unsigned_long *f;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  double n;
  double H0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30 [2];
  double local_20;
  double local_18;
  
  local_18 = 0.0;
  auVar4 = vcvtusi2sd_avx512f((undefined1  [16])0x0,in_RSI);
  auVar3 = ZEXT1664(auVar4);
  local_20 = auVar4._0_8_;
  local_30[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(local_30);
    if (*puVar2 != 0) {
      auVar4 = vcvtusi2sd_avx512f(auVar3._0_16_,*puVar2);
      in_stack_ffffffffffffffb0 =
           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)(auVar4._0_8_ / local_20);
      auVar3._0_8_ = log2((double)in_stack_ffffffffffffffb0);
      auVar3._8_56_ = extraout_var;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = in_stack_ffffffffffffffb0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_18;
      auVar4 = vfmadd213sd_fma(auVar3._0_16_,auVar4,auVar5);
      auVar3 = ZEXT1664(auVar4);
      local_18 = auVar4._0_8_;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(local_30);
  }
  return -local_18;
}

Assistant:

double entropy(const std::vector<X>& freqs, size_t freqs_sum)
{
    double H0 = 0.0;
    double n = freqs_sum;
    for (const auto& f : freqs) {
        if (f != 0) {
            double p = double(f) / n;
            H0 += (p * log2(p));
        }
    }
    return -H0;
}